

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedEnumFieldGenerator::GenerateSerializationCode
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "for (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnum($number$, $name$_.get(i).getNumber());\n}\n"
  ;
  if (*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) != '\0') {
    text = 
    "if (get$capitalized_name$List().size() > 0) {\n  output.writeRawVarint32($tag$);\n  output.writeRawVarint32($name$MemoizedSerializedSize);\n}\nfor (int i = 0; i < $name$_.size(); i++) {\n  output.writeEnumNoTag($name$_.get(i).getNumber());\n}\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (get$capitalized_name$List().size() > 0) {\n"
      "  output.writeRawVarint32($tag$);\n"
      "  output.writeRawVarint32($name$MemoizedSerializedSize);\n"
      "}\n"
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  output.writeEnumNoTag($name$_.get(i).getNumber());\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  output.writeEnum($number$, $name$_.get(i).getNumber());\n"
      "}\n");
  }
}